

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O0

int HU_GetRowColor(player_t *player,bool highlight)

{
  bool bVar1;
  uint uiTeam;
  int iVar2;
  FTeam *this;
  FIntCVar *local_30;
  FIntCVar *local_28;
  bool highlight_local;
  player_t *player_local;
  
  bVar1 = FBoolCVar::operator_cast_to_bool(&teamplay);
  if ((bVar1) && (iVar2 = FIntCVar::operator_cast_to_int(&deathmatch), iVar2 != 0)) {
    uiTeam = userinfo_t::GetTeam(&player->userinfo);
    bVar1 = FTeam::IsValidTeam(&TeamLibrary,uiTeam);
    if (bVar1) {
      iVar2 = userinfo_t::GetTeam(&player->userinfo);
      this = TArray<FTeam,_FTeam>::operator[](&Teams,(long)iVar2);
      player_local._4_4_ = FTeam::GetTextColor(this);
    }
    else {
      player_local._4_4_ = 2;
    }
  }
  else if (highlight) {
    iVar2 = FIntCVar::operator_cast_to_int(&deathmatch);
    if (iVar2 == 0) {
      local_30 = &sb_cooperative_yourplayercolor;
    }
    else {
      local_30 = &sb_deathmatch_yourplayercolor;
    }
    player_local._4_4_ = FIntCVar::operator_cast_to_int(local_30);
  }
  else if (((demoplayback & 1U) == 0) ||
          (player != (player_t *)(&players + (long)consoleplayer * 0x54))) {
    iVar2 = FIntCVar::operator_cast_to_int(&deathmatch);
    if (iVar2 == 0) {
      local_28 = &sb_cooperative_otherplayercolor;
    }
    else {
      local_28 = &sb_deathmatch_otherplayercolor;
    }
    player_local._4_4_ = FIntCVar::operator_cast_to_int(local_28);
  }
  else {
    player_local._4_4_ = 5;
  }
  return player_local._4_4_;
}

Assistant:

int HU_GetRowColor(player_t *player, bool highlight)
{
	if (teamplay && deathmatch)
	{
		if (TeamLibrary.IsValidTeam (player->userinfo.GetTeam()))
			return Teams[player->userinfo.GetTeam()].GetTextColor();
		else
			return CR_GREY;
	}
	else
	{
		if (!highlight)
		{
			if (demoplayback && player == &players[consoleplayer])
			{
				return CR_GOLD;
			}
			else
			{
				return deathmatch ? sb_deathmatch_otherplayercolor : sb_cooperative_otherplayercolor;
			}
		}
		else
		{
			return deathmatch ? sb_deathmatch_yourplayercolor : sb_cooperative_yourplayercolor;
		}
	}
}